

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O2

void foo2(int *a)

{
  ostream *poVar1;
  runtime_error *this;
  saver_success<int_&> SAVER_SUCCES_1;
  
  std::uncaught_exceptions();
  *a = 2;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo2 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void foo2(int& a) {
  SAVER_SUCCESS(a); // Custom state saver on success.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  throw std::runtime_error{"error"};
  // Original state will not automatically restored, on error.
}